

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# handle_priority.cxx
# Opt level: O3

void __thiscall
nuraft::raft_server::broadcast_priority_change(raft_server *this,int srv_id,int new_priority)

{
  _Atomic_word _Var1;
  int32 iVar2;
  _func_int *p_Var3;
  element_type *peVar4;
  __int_type_conflict _Var5;
  peer *this_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_01;
  int iVar6;
  undefined4 extraout_var;
  _func_int **pp_Var7;
  undefined4 extraout_var_00;
  raft_server *this_02;
  _Hash_node_base *p_Var8;
  _func_int **pp_Var9;
  bool bVar10;
  ptr<buffer> buf;
  ptr<req_msg> req;
  ptr<log_entry> le;
  ptr<cluster_config> cur_config;
  undefined1 local_d1;
  raft_server *local_d0;
  shared_ptr<nuraft::buffer> local_c8;
  int local_b4;
  ptr<peer> local_b0;
  ptr<req_msg> local_a0;
  string local_90;
  value_type local_70;
  rpc_handler *local_60;
  _func_int **local_58;
  _func_int **local_50;
  _Hash_node_base *local_48;
  _func_int **local_40;
  element_type *local_38;
  
  if (this->id_ == srv_id) {
    this->my_priority_ = new_priority;
  }
  local_d0 = this;
  get_config((raft_server *)&stack0xffffffffffffffc0);
  pp_Var9 = (_func_int **)local_40[7];
  if (pp_Var9 != local_40 + 7) {
    do {
      p_Var3 = pp_Var9[2];
      if (*(int *)p_Var3 == srv_id) {
        peVar4 = (local_d0->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr;
        if ((peVar4 != (element_type *)0x0) && (iVar6 = (*peVar4->_vptr_logger[7])(), 3 < iVar6)) {
          peVar4 = (local_d0->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr;
          msg_if_given_abi_cxx11_
                    (&local_90,"Change server %d priority %d -> %d",(ulong)(uint)srv_id,
                     (ulong)*(uint *)(p_Var3 + 0x4c),(ulong)(uint)new_priority);
          (*peVar4->_vptr_logger[8])
                    (peVar4,4,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_priority.cxx"
                     ,"broadcast_priority_change",0x71,&local_90);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_90._M_dataplus._M_p != &local_90.field_2) {
            operator_delete(local_90._M_dataplus._M_p);
          }
        }
        *(int *)(p_Var3 + 0x4c) = new_priority;
      }
      pp_Var9 = (_func_int **)*pp_Var9;
    } while (pp_Var9 != local_40 + 7);
  }
  p_Var8 = (local_d0->peers_)._M_h._M_before_begin._M_nxt;
  if (p_Var8 != (_Hash_node_base *)0x0) {
    local_60 = &local_d0->resp_handler_;
    local_50 = (_func_int **)&PTR___Sp_counted_ptr_inplace_0061c4f0;
    local_58 = (_func_int **)&PTR__req_msg_0061c540;
    this_02 = local_d0;
    local_b4 = srv_id;
    do {
      _Var5 = (((this_02->state_).super___shared_ptr<nuraft::srv_state,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr)->term_).super___atomic_base<unsigned_long>._M_i;
      _Var1 = *(_Atomic_word *)&(p_Var8[2]._M_nxt)->_M_nxt->_M_nxt;
      local_48 = p_Var8;
      iVar6 = (*((this_02->log_store_).
                 super___shared_ptr<nuraft::log_store,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                _vptr_log_store[2])();
      pp_Var7 = (_func_int **)term_for_log(this_02,CONCAT44(extraout_var,iVar6) - 1);
      iVar6 = (*((this_02->log_store_).
                 super___shared_ptr<nuraft::log_store,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                _vptr_log_store[2])();
      pp_Var9 = (_func_int **)(this_02->quick_commit_index_).super___atomic_base<unsigned_long>._M_i
      ;
      local_a0.super___shared_ptr<nuraft::req_msg,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x60);
      (local_a0.super___shared_ptr<nuraft::req_msg,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
      _M_use_count = 1;
      (local_a0.super___shared_ptr<nuraft::req_msg,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
      _M_weak_count = 1;
      (local_a0.super___shared_ptr<nuraft::req_msg,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
      _vptr__Sp_counted_base = local_50;
      local_a0.super___shared_ptr<nuraft::req_msg,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)
           (local_a0.super___shared_ptr<nuraft::req_msg,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
            _M_pi + 1);
      iVar2 = this_02->id_;
      local_a0.super___shared_ptr<nuraft::req_msg,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi[1].
      _M_use_count = (int)_Var5;
      local_a0.super___shared_ptr<nuraft::req_msg,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi[1].
      _M_weak_count = (int)(_Var5 >> 0x20);
      *(undefined4 *)
       &local_a0.super___shared_ptr<nuraft::req_msg,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
        [2]._vptr__Sp_counted_base = 0x18;
      *(int32 *)((long)&local_a0.super___shared_ptr<nuraft::req_msg,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount._M_pi[2]._vptr__Sp_counted_base + 4) = iVar2;
      local_a0.super___shared_ptr<nuraft::req_msg,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi[2].
      _M_use_count = _Var1;
      local_a0.super___shared_ptr<nuraft::req_msg,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi[1].
      _vptr__Sp_counted_base = local_58;
      local_a0.super___shared_ptr<nuraft::req_msg,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi[3].
      _vptr__Sp_counted_base = pp_Var7;
      *(long *)&local_a0.super___shared_ptr<nuraft::req_msg,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                ._M_pi[3]._M_use_count = CONCAT44(extraout_var_00,iVar6) + -1;
      local_a0.super___shared_ptr<nuraft::req_msg,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi[4].
      _vptr__Sp_counted_base = pp_Var9;
      local_a0.super___shared_ptr<nuraft::req_msg,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi[4].
      _M_use_count = 0;
      local_a0.super___shared_ptr<nuraft::req_msg,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi[4].
      _M_weak_count = 0;
      local_a0.super___shared_ptr<nuraft::req_msg,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi[5].
      _vptr__Sp_counted_base = (_func_int **)0x0;
      local_a0.super___shared_ptr<nuraft::req_msg,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi[5].
      _M_use_count = 0;
      local_a0.super___shared_ptr<nuraft::req_msg,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi[5].
      _M_weak_count = 0;
      buffer::alloc((buffer *)&local_c8,8);
      buffer::pos(local_c8.super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr,0);
      p_Var8 = local_48;
      buffer::put(local_c8.super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                  local_b4);
      buffer::put(local_c8.super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                  new_priority);
      buffer::pos(local_c8.super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr,0);
      this_02 = local_d0;
      local_90._M_dataplus._M_p =
           (pointer)(((local_d0->state_).
                      super___shared_ptr<nuraft::srv_state,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                    term_).super___atomic_base<unsigned_long>._M_i;
      local_70.super___shared_ptr<nuraft::log_entry,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)0x0;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
      __shared_count<nuraft::log_entry,std::allocator<nuraft::log_entry>,unsigned_long,std::shared_ptr<nuraft::buffer>&>
                (&local_70.super___shared_ptr<nuraft::log_entry,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount,(log_entry **)&local_70,(allocator<nuraft::log_entry> *)&local_d1,
                 (unsigned_long *)&local_90,&local_c8);
      std::
      vector<std::shared_ptr<nuraft::log_entry>,_std::allocator<std::shared_ptr<nuraft::log_entry>_>_>
      ::push_back(&(local_a0.super___shared_ptr<nuraft::req_msg,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
                   ->log_entries_,&local_70);
      this_00 = (peer *)p_Var8[2]._M_nxt;
      this_01 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)p_Var8[3]._M_nxt;
      if (this_01 == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        LOCK();
        bVar10 = (this_00->busy_flag_)._M_base._M_i == false;
        if (bVar10) {
          (this_00->busy_flag_)._M_base._M_i = true;
        }
        UNLOCK();
        if (bVar10) {
          local_b0.super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
               (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          goto LAB_002236c7;
        }
LAB_00223644:
        peVar4 = (this_02->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr
        ;
        if ((peVar4 != (element_type *)0x0) && (iVar6 = (*peVar4->_vptr_logger[7])(), 1 < iVar6)) {
          peVar4 = (this_02->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr;
          msg_if_given_abi_cxx11_
                    (&local_90,"peer %d is currently busy, cannot send request",
                     (ulong)(uint)((this_00->config_).
                                   super___shared_ptr<nuraft::srv_config,_(__gnu_cxx::_Lock_policy)2>
                                  ._M_ptr)->id_);
          (*peVar4->_vptr_logger[8])
                    (peVar4,2,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_priority.cxx"
                     ,"broadcast_priority_change",0x92,&local_90);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_90._M_dataplus._M_p != &local_90.field_2) {
            operator_delete(local_90._M_dataplus._M_p);
          }
        }
      }
      else {
        if (__libc_single_threaded == '\0') {
          LOCK();
          this_01->_M_use_count = this_01->_M_use_count + 1;
          UNLOCK();
        }
        else {
          this_01->_M_use_count = this_01->_M_use_count + 1;
        }
        LOCK();
        bVar10 = (this_00->busy_flag_)._M_base._M_i == false;
        if (bVar10) {
          (this_00->busy_flag_)._M_base._M_i = true;
        }
        UNLOCK();
        if (!bVar10) goto LAB_00223644;
        local_b0.super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
             this_01;
        if (__libc_single_threaded == '\0') {
          LOCK();
          this_01->_M_use_count = this_01->_M_use_count + 1;
          UNLOCK();
        }
        else {
          this_01->_M_use_count = this_01->_M_use_count + 1;
        }
LAB_002236c7:
        local_b0.super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>._M_ptr = this_00;
        peer::send_req(this_00,&local_b0,&local_a0,local_60);
        if (local_b0.super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
            != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (local_b0.super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi);
        }
      }
      if (this_01 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_01);
      }
      if (local_70.super___shared_ptr<nuraft::log_entry,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_70.super___shared_ptr<nuraft::log_entry,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi);
      }
      if (local_c8.super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
          != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_c8.super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi);
      }
      if (local_a0.super___shared_ptr<nuraft::req_msg,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
          != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_a0.super___shared_ptr<nuraft::req_msg,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi);
      }
      p_Var8 = p_Var8->_M_nxt;
    } while (p_Var8 != (_Hash_node_base *)0x0);
  }
  if (local_38 != (element_type *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_38);
  }
  return;
}

Assistant:

void raft_server::broadcast_priority_change(const int srv_id,
                                            const int new_priority)
{
    if (srv_id == id_) {
        my_priority_ = new_priority;
    }
    ptr<cluster_config> cur_config = get_config();
    for (auto& entry: cur_config->get_servers()) {
        srv_config* s_conf = entry.get();
        if (s_conf->get_id() == srv_id) {
            p_in("Change server %d priority %d -> %d",
                 srv_id, s_conf->get_priority(), new_priority);
            s_conf->set_priority(new_priority);
        }
    }

    // If there is no live leader now,
    // broadcast this request to all peers.
    for (peer_itor it = peers_.begin(); it != peers_.end(); ++it) {
        ptr<req_msg> req( cs_new<req_msg>
                          ( state_->get_term(),
                            msg_type::priority_change_request,
                            id_,
                            it->second->get_id(),
                            term_for_log(log_store_->next_slot() - 1),
                            log_store_->next_slot() - 1,
                            quick_commit_index_.load() ) );

        // ID + priority
        ptr<buffer> buf = buffer::alloc(sz_int * 2);
        buf->pos(0);
        buf->put((int32)srv_id);
        buf->put((int32)new_priority);
        buf->pos(0);
        ptr<log_entry> le = cs_new<log_entry>(state_->get_term(), buf);

        std::vector< ptr<log_entry> >& v = req->log_entries();
        v.push_back(le);

        ptr<peer> pp = it->second;
        if (pp->make_busy()) {
            pp->send_req(pp, req, resp_handler_);
        } else {
            p_er("peer %d is currently busy, cannot send request",
                 pp->get_id());
        }
    }
}